

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O2

void TestConstExpr::ConstTestT<unsigned_short>(void)

{
  undefined1 extraout_AL;
  undefined1 extraout_AL_00;
  undefined1 extraout_AH;
  undefined1 extraout_AH_00;
  undefined2 extraout_var;
  undefined2 extraout_var_00;
  
  if (ConstTestT<unsigned_short>()::t == '\0') {
    __cxa_guard_acquire(&ConstTestT<unsigned_short>()::t);
    if ((CONCAT22(extraout_var,CONCAT11(extraout_AH,extraout_AL)) &
        CONCAT22(extraout_var,CONCAT11(extraout_AH,extraout_AL))) != 0) {
      ConstTestT<unsigned_short>::t = ConstConstructor<unsigned_short>();
      __cxa_guard_release(&ConstTestT<unsigned_short>()::t);
    }
  }
  if (ConstTestT<unsigned_short>()::b == '\0') {
    __cxa_guard_acquire(&ConstTestT<unsigned_short>()::b);
    if ((CONCAT22(extraout_var_00,CONCAT11(extraout_AH_00,extraout_AL_00)) &
        CONCAT22(extraout_var_00,CONCAT11(extraout_AH_00,extraout_AL_00))) != 0) {
      ConstTestT<unsigned_short>::b = ConstBool<unsigned_short>();
      __cxa_guard_release(&ConstTestT<unsigned_short>()::b);
      return;
    }
  }
  return;
}

Assistant:

void ConstTestT()
	{
		static const T t = ConstConstructor<T>();
		static const bool b = ConstBool<T>();
	}